

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

bool __thiscall asmjit::v1_14::String::equals(String *this,char *other,size_t size)

{
  int iVar1;
  ulong in_RDX;
  void *in_RSI;
  byte *in_RDI;
  size_t i;
  size_t bSize;
  size_t aSize;
  char *bData;
  char *aData;
  ulong local_90;
  byte *local_80;
  ulong local_68;
  bool local_21;
  
  if (*in_RDI < 0x1f) {
    local_80 = in_RDI + 1;
  }
  else {
    local_80 = *(byte **)(in_RDI + 0x18);
  }
  if (*in_RDI < 0x1f) {
    local_90 = (ulong)*in_RDI;
  }
  else {
    local_90 = *(ulong *)(in_RDI + 8);
  }
  if (in_RDX == 0xffffffffffffffff) {
    for (local_68 = 0; local_68 < local_90; local_68 = local_68 + 1) {
      if ((local_80[local_68] != *(byte *)((long)in_RSI + local_68)) ||
         (*(char *)((long)in_RSI + local_68) == '\0')) {
        return false;
      }
    }
    local_21 = *(char *)((long)in_RSI + local_68) == '\0';
  }
  else if (local_90 == in_RDX) {
    iVar1 = memcmp(local_80,in_RSI,local_90);
    local_21 = iVar1 == 0;
  }
  else {
    local_21 = false;
  }
  return local_21;
}

Assistant:

bool String::equals(const char* other, size_t size) const noexcept {
  const char* aData = data();
  const char* bData = other;

  size_t aSize = this->size();
  size_t bSize = size;

  if (bSize == SIZE_MAX) {
    size_t i;
    for (i = 0; i < aSize; i++)
      if (aData[i] != bData[i] || bData[i] == 0)
        return false;
    return bData[i] == 0;
  }
  else {
    if (aSize != bSize)
      return false;
    return ::memcmp(aData, bData, aSize) == 0;
  }
}